

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_registrymanager.c
# Opt level: O0

IOTHUB_REGISTRYMANAGER_RESULT
IoTHubRegistryManager_UpdateDevice
          (IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle,
          IOTHUB_REGISTRY_DEVICE_UPDATE *deviceUpdate)

{
  undefined1 local_68 [8];
  IOTHUB_REGISTRY_DEVICE_OR_MODULE_UPDATE deviceOrModuleUpdate;
  LOGGER_LOG l;
  IOTHUB_REGISTRYMANAGER_RESULT result;
  IOTHUB_REGISTRY_DEVICE_UPDATE *deviceUpdate_local;
  IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle_local;
  
  if ((registryManagerHandle == (IOTHUB_REGISTRYMANAGER_HANDLE)0x0) ||
     (deviceUpdate == (IOTHUB_REGISTRY_DEVICE_UPDATE *)0x0)) {
    deviceOrModuleUpdate.managedBy = (char *)xlogging_get_log_function();
    if ((LOGGER_LOG)deviceOrModuleUpdate.managedBy != (LOGGER_LOG)0x0) {
      (*(code *)deviceOrModuleUpdate.managedBy)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                 ,"IoTHubRegistryManager_UpdateDevice",0x6c5,1,"Input parameter cannot be NULL");
    }
    l._4_4_ = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
  }
  else {
    memset(local_68,0,0x40);
    local_68._0_4_ = IOTHUB_REGISTRYMANAGER_MODEL_TYPE_DEVICE;
    deviceOrModuleUpdate._0_8_ = deviceUpdate->deviceId;
    deviceOrModuleUpdate.deviceId = deviceUpdate->primaryKey;
    deviceOrModuleUpdate.primaryKey = deviceUpdate->secondaryKey;
    deviceOrModuleUpdate.secondaryKey._0_4_ = deviceUpdate->status;
    deviceOrModuleUpdate.secondaryKey._4_4_ = deviceUpdate->authMethod;
    deviceOrModuleUpdate.status._0_1_ = IOTHUB_DEVICE_STATUS_ENABLED;
    l._4_4_ = IoTHubRegistryManager_UpdateDeviceOrModule
                        (registryManagerHandle,(IOTHUB_REGISTRY_DEVICE_OR_MODULE_UPDATE *)local_68);
  }
  return l._4_4_;
}

Assistant:

IOTHUB_REGISTRYMANAGER_RESULT IoTHubRegistryManager_UpdateDevice(IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle, IOTHUB_REGISTRY_DEVICE_UPDATE* deviceUpdate)
{
    IOTHUB_REGISTRYMANAGER_RESULT result;

    if (registryManagerHandle == NULL || deviceUpdate == NULL)
    {
        LogError("Input parameter cannot be NULL");
        result = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
    }
    else
    {
        IOTHUB_REGISTRY_DEVICE_OR_MODULE_UPDATE deviceOrModuleUpdate;
        memset(&deviceOrModuleUpdate, 0, sizeof(deviceOrModuleUpdate));

        //Convert to generic update struct
        deviceOrModuleUpdate.type = IOTHUB_REGISTRYMANAGER_MODEL_TYPE_DEVICE;
        deviceOrModuleUpdate.deviceId = deviceUpdate->deviceId;
        deviceOrModuleUpdate.primaryKey = deviceUpdate->primaryKey;
        deviceOrModuleUpdate.secondaryKey = deviceUpdate->secondaryKey;
        deviceOrModuleUpdate.status = deviceUpdate->status;
        deviceOrModuleUpdate.authMethod = deviceUpdate->authMethod;
        deviceOrModuleUpdate.iotEdge_capable = false;   //IOTHUB_REGISTRY_DEVICE_UPDATE does not have this field, so set false

        result = IoTHubRegistryManager_UpdateDeviceOrModule(registryManagerHandle, &deviceOrModuleUpdate);
    }

    return result;
}